

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2raster.cpp
# Opt level: O1

bool32 rw::ps2::imageFindRasterFormat
                 (Image *img,int32 type,int32 *pWidth,int32 *pHeight,int32 *pDepth,int32 *pFormat)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  
  iVar2 = 1;
  do {
    iVar3 = iVar2;
    iVar2 = iVar3 * 2;
  } while (iVar3 < img->width);
  iVar2 = 1;
  do {
    iVar1 = iVar2;
    iVar2 = iVar1 * 2;
  } while (iVar1 < img->height);
  iVar2 = img->depth;
  switch(iVar2 << 0x1e | iVar2 - 4U >> 2) {
  case 0:
    uVar4 = 0x4500;
    break;
  case 1:
    uVar4 = 0x2500;
    break;
  default:
    imageFindRasterFormat();
    return 0;
  case 3:
    uVar4 = 0x100;
    break;
  case 5:
  case 7:
    uVar4 = 0x500;
    iVar2 = 0x20;
  }
  *pWidth = iVar3;
  *pHeight = iVar1;
  *pDepth = iVar2;
  *pFormat = uVar4 | type;
  return 1;
}

Assistant:

bool32
imageFindRasterFormat(Image *img, int32 type,
	int32 *pWidth, int32 *pHeight, int32 *pDepth, int32 *pFormat)
{
	int32 width, height, depth, format;

	assert((type&0xF) == Raster::TEXTURE);

	for(width = 1; width < img->width; width <<= 1);
	for(height = 1; height < img->height; height <<= 1);

	depth = img->depth;

	switch(depth){
	case 32:
	case 24:
		// C888 24 bit is unsafe
		format = Raster::C8888;
		depth = 32;
		break;
	case 16:
		format = Raster::C1555;
		break;
	case 8:
		format = Raster::PAL8 | Raster::C8888;
		break;
	case 4:
		format = Raster::PAL4 | Raster::C8888;
		break;
	default:
		RWERROR((ERR_INVRASTER));
		return 0;
	}

	format |= type;

	*pWidth = width;
	*pHeight = height;
	*pDepth = depth;
	*pFormat = format;

	return 1;
}